

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

void * isotree_deserialize_from_raw(char *serialized_model,int nthreads)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  ExtIsoForest *pEVar10;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> uVar11;
  pointer pvVar12;
  pointer pvVar13;
  long lVar14;
  __uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
  this;
  ExtIsoForest *pEVar15;
  Imputer *pIVar16;
  runtime_error *prVar17;
  NewCategAction *pNVar18;
  size_t sVar19;
  bool has_combined_objects;
  bool is_compatible;
  bool is_isotree_model;
  bool has_metadata;
  bool has_Indexer;
  bool has_Imputer;
  bool has_ExtIsoForest;
  bool has_IsoForest;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> out;
  TreesIndexer local_188;
  char *local_170;
  Imputer local_168;
  size_t size_metadata;
  ExtIsoForest local_e8;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> local_98;
  ExtIsoForest local_78;
  
  if (serialized_model == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Passed NULL \'serialized_model\' to \'isotree_deserialize_from_raw\'.",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return (void *)0x0;
  }
  is_isotree_model = false;
  is_compatible = false;
  has_combined_objects = false;
  has_IsoForest = false;
  has_ExtIsoForest = false;
  has_Imputer = false;
  has_Indexer = false;
  has_metadata = false;
  size_metadata = 0;
  inspect_serialized_object
            (serialized_model,&is_isotree_model,&is_compatible,&has_combined_objects,&has_IsoForest,
             &has_ExtIsoForest,&has_Imputer,&has_Indexer,&has_metadata,&size_metadata);
  if (((is_isotree_model == true) && (is_compatible == true)) && (has_combined_objects == false)) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"Serialized model is not compatible.\n");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_e8.exp_avg_sep = 0.0;
  local_e8.orig_sample_size = 0;
  local_e8.missing_action = Fail;
  local_e8.scoring_metric = Depth;
  local_e8.exp_avg_depth = 0.0;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.new_cat_action = Weighted;
  local_e8.cat_split_type = SubSet;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170 = (char *)0x0;
  local_e8.has_range_penalty = false;
  local_e8._65_7_ = 0;
  local_78.has_range_penalty = false;
  local_78._65_7_ = 0;
  local_78.exp_avg_sep = 0.0;
  local_78.orig_sample_size = 0;
  local_78.missing_action = Fail;
  local_78.scoring_metric = Depth;
  local_78.exp_avg_depth = 0.0;
  local_78.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.new_cat_action = Weighted;
  local_78.cat_split_type = SubSet;
  local_78.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.ncols_numeric = 0;
  local_168.ncols_categ = 0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (size_metadata != 0) {
    local_170 = (char *)operator_new__(size_metadata);
  }
  deserialize_combined
            (serialized_model,(IsoForest *)&local_e8,&local_78,&local_168,&local_188,local_170);
  pvVar13 = local_168.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar12 = local_168.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar19 = 1;
  if (((long)local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0) &&
     (sVar19 = 3,
     local_78.hplanes.
     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish ==
     local_78.hplanes.
     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"Error: model contains no trees.\n");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar14 = (long)local_e8.hplanes.
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_e8.hplanes.
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e8.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = (long)local_78.hplanes.
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.hplanes.
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((local_168.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       local_168.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((long)local_168.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_168.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == lVar14)) {
    if ((local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (((long)local_188.indices.
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_188.indices.
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5 +
        (lVar14 >> 3) * 0x5555555555555555 == 0)) {
      this.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
            )operator_new(0x1d8);
      memset((void *)this.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl,0,0x1d8)
      ;
      isotree::IsolationForest::IsolationForest
                ((IsolationForest *)
                 this.
                 super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                 .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl);
      *(int *)this.
              super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              ._M_t.
              super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
              .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl = nthreads;
      *(size_t *)
       ((long)this.
              super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              ._M_t.
              super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
              .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x10) =
           sVar19;
      *(long *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x30)
           = (lVar14 >> 3) * -0x5555555555555555;
      *(bool *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0xa6)
           = pvVar12 != pvVar13;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
              )this.
               super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
               ._M_t.
               super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
               .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      if (local_e8.hplanes.
          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_e8.hplanes.
          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pEVar15 = isotree::IsolationForest::get_model_ext
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        pEVar10 = &local_78;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_78.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::~vector((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   *)&local_98);
      }
      else {
        pEVar15 = (ExtIsoForest *)
                  isotree::IsolationForest::get_model
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        pEVar10 = &local_e8;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pEVar15->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar15->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)&local_98);
      }
      pNVar18 = &pEVar10->new_cat_action;
      uVar5 = *(undefined8 *)pNVar18;
      uVar6 = *(undefined8 *)(pNVar18 + 2);
      dVar7 = *(double *)(pNVar18 + 4);
      dVar8 = *(double *)(pNVar18 + 6);
      uVar9 = *(undefined8 *)((long)&pEVar10->orig_sample_size + 1);
      *(undefined8 *)((long)&pEVar15->exp_avg_sep + 1) =
           *(undefined8 *)((long)&pEVar10->exp_avg_sep + 1);
      *(undefined8 *)((long)&pEVar15->orig_sample_size + 1) = uVar9;
      pEVar15->exp_avg_depth = dVar7;
      pEVar15->exp_avg_sep = dVar8;
      *(undefined8 *)&pEVar15->new_cat_action = uVar5;
      *(undefined8 *)&pEVar15->missing_action = uVar6;
      if (local_168.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_168.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pIVar16 = isotree::IsolationForest::get_imputer
                            ((IsolationForest *)
                             out._M_t.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        pIVar16->ncols_numeric = local_168.ncols_numeric;
        pIVar16->ncols_categ = local_168.ncols_categ;
        piVar1 = (pIVar16->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (pIVar16->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pIVar16->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pIVar16->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pIVar16->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
        }
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pIVar16->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pIVar16->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pIVar16->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        (pIVar16->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_168.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pIVar16->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_168.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pIVar16->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_168.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_168.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   *)&local_98);
        pdVar3 = (pIVar16->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (pIVar16->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pIVar16->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pIVar16->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pIVar16->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pdVar3 != (pointer)0x0) {
          operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3);
        }
        piVar1 = (pIVar16->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (pIVar16->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pIVar16->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pIVar16->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pIVar16->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
        }
      }
      if (local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c8)
        ;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c8) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1b8)
        ;
        local_98.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c0)
        ;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1b8) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c0) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&local_98);
      }
      uVar11._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           out._M_t.
           super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
           ._M_t.
           super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
           .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              )0x0;
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      ~unique_ptr(&out);
      if (local_170 != (char *)0x0) {
        operator_delete__(local_170);
      }
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&local_188.indices);
      if (local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.col_modes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_168.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.col_means.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.col_means.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.col_means.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ::~vector(&local_168.imputer_tree);
      if (local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::~vector(&local_78.hplanes);
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)&local_e8);
      return (void *)(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      )uVar11._M_t.
                       super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                       .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
    }
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"Error: indexer has incorrect number of trees.\n");
  }
  else {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"Error: imputer has incorrect number of trees.\n");
  }
  __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_raw(const char *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed NULL 'serialized_model' to 'isotree_deserialize_from_raw'." << std::endl;
        return nullptr;
    }

    try
    {
        bool is_isotree_model = false;
        bool is_compatible = false;
        bool has_combined_objects = false;
        bool has_IsoForest = false;
        bool has_ExtIsoForest = false;
        bool has_Imputer = false;
        bool has_Indexer = false;
        bool has_metadata = false;
        size_t size_metadata = 0;
        inspect_serialized_object(
            serialized_model,
            is_isotree_model,
            is_compatible,
            has_combined_objects,
            has_IsoForest,
            has_ExtIsoForest,
            has_Imputer,
            has_Indexer,
            has_metadata,
            size_metadata
        );
        if (is_isotree_model && is_compatible && !has_combined_objects)
            throw std::runtime_error("Serialized model is not compatible.\n");

        IsoForest model = IsoForest();
        ExtIsoForest model_ext = ExtIsoForest();
        Imputer imputer = Imputer();
        TreesIndexer indexer = TreesIndexer();

        std::unique_ptr<char[]> buffer_metadata;
        if (size_metadata) {
            buffer_metadata = std::unique_ptr<char[]>(new char[size_metadata]);
        }

        deserialize_combined(
            serialized_model,
            &model,
            &model_ext,
            &imputer,
            &indexer,
            size_metadata? buffer_metadata.get() : (char*)nullptr
        );

        if (!model.trees.size() && !model_ext.hplanes.size())
            throw std::runtime_error("Error: model contains no trees.\n");

        size_t ntrees;
        size_t ndim = 3;
        bool build_imputer = false;

        if (!model.trees.empty()) {
            ntrees = model.trees.size();
            ndim = 1;
        }
        else {
            ntrees = model_ext.hplanes.size();
        }
        if (!imputer.imputer_tree.empty()) {
            if (imputer.imputer_tree.size() != ntrees)
                throw std::runtime_error("Error: imputer has incorrect number of trees.\n");
            build_imputer = true;
        }
        if (!indexer.indices.empty()) {
            if (indexer.indices.size() != ntrees)
                throw std::runtime_error("Error: indexer has incorrect number of trees.\n");
        }

        std::unique_ptr<IsolationForest> out(new IsolationForest());
        out->nthreads = nthreads;
        out->ndim = ndim;
        out->ntrees = ntrees;
        out->build_imputer = build_imputer;

        if (!model.trees.empty())
            out->get_model() = std::move(model);
        else
            out->get_model_ext() = std::move(model_ext);
        if (!imputer.imputer_tree.empty())
            out->get_imputer() = std::move(imputer);
        if (!indexer.indices.empty())
            out->indexer = std::move(indexer);

        return out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}